

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderFragDataTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::FragDataDrawBuffersCase::iterate
          (FragDataDrawBuffersCase *this)

{
  void **__return_storage_ptr__;
  code *pcVar1;
  deUint64 dVar2;
  bool bVar3;
  deUint32 dVar4;
  deBool dVar5;
  int iVar6;
  RenderContext *renderCtx_00;
  ProgramSources *pPVar7;
  long lVar8;
  TestLog *pTVar9;
  NotSupportedError *this_00;
  TestError *this_01;
  float *pfVar10;
  MessageBuilder *pMVar11;
  RenderTarget *this_02;
  PixelFormat *this_03;
  char *description;
  VertexArrayBinding *local_9a8;
  deUint32 local_8c8;
  undefined4 local_870;
  RGBA local_81c;
  PixelBufferAccess local_818;
  MessageBuilder local_7f0;
  int local_66c;
  byte local_665;
  int ndx_2;
  RGBA RStack_660;
  bool allOk;
  RGBA local_65c;
  undefined1 local_658 [4];
  RGBA threshold;
  Surface result;
  int local_624;
  undefined1 local_620 [4];
  int ndx_1;
  deUint32 local_4a0;
  Vector<float,_4> local_49c;
  deUint32 local_48c;
  Vector<float,_4> local_488;
  undefined8 local_478;
  deUint32 drawBuffers [2];
  int local_468;
  deUint32 rbo;
  int ndx;
  undefined1 local_43a;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410;
  void **local_3f0;
  undefined1 local_3e8 [8];
  VertexArrayBinding vertexArrays [2];
  deUint8 local_340 [8];
  deUint8 indices [6];
  float colors [16];
  float positions [8];
  undefined1 local_2d0 [8];
  Renderbuffer colorBuf1;
  Renderbuffer colorBuf0;
  Framebuffer fbo;
  int indexLoc;
  int height;
  int width;
  Functions *gl;
  string local_268;
  ShaderSource local_248;
  allocator<char> local_209;
  string local_208;
  ShaderSource local_1e8;
  ProgramSources local_1c0;
  undefined1 local_f0 [8];
  ShaderProgram program;
  RenderContext *renderCtx;
  FragDataDrawBuffersCase *this_local;
  
  renderCtx_00 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  program.m_program.m_info.linkTimeUs = (deUint64)renderCtx_00;
  glu::ProgramSources::ProgramSources(&local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,&local_209);
  glu::VertexSource::VertexSource((VertexSource *)&local_1e8,&local_208);
  pPVar7 = glu::ProgramSources::operator<<(&local_1c0,&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,
             "varying mediump vec4 v_color;\nuniform mediump int u_index;\nvoid main (void)\n{\n\tgl_FragData[u_index] = v_color;\n}\n"
             ,(allocator<char> *)((long)&gl + 7));
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_248,&local_268);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_248);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_f0,renderCtx_00,pPVar7);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gl + 7));
  glu::VertexSource::~VertexSource((VertexSource *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  glu::ProgramSources::~ProgramSources(&local_1c0);
  lVar8 = (**(code **)(*(long *)program.m_program.m_info.linkTimeUs + 0x18))();
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_f0);
  if (bVar3) {
    pcVar1 = *(code **)(lVar8 + 0xb48);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f0);
    local_870 = (*pcVar1)(dVar4,"u_index");
  }
  else {
    local_870 = 0xffffffff;
  }
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&colorBuf0.super_ObjectWrapper.m_object,
             (RenderContext *)program.m_program.m_info.linkTimeUs);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)&colorBuf1.super_ObjectWrapper.m_object,
             (RenderContext *)program.m_program.m_info.linkTimeUs);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_2d0,
             (RenderContext *)program.m_program.m_info.linkTimeUs);
  colors[0xe] = -1.0;
  colors[0xf] = -1.0;
  colors[10] = 0.0;
  colors[0xb] = 1.0;
  colors[0xc] = 0.0;
  colors[0xd] = 1.0;
  colors[6] = 0.0;
  colors[7] = 1.0;
  colors[8] = 0.0;
  colors[9] = 1.0;
  colors[2] = 0.0;
  colors[3] = 1.0;
  colors[4] = 0.0;
  colors[5] = 1.0;
  _indices = 0x3f80000000000000;
  colors[0] = 0.0;
  colors[1] = 1.0;
  local_340[4] = '\x01';
  local_340[5] = '\x03';
  local_340[0] = '\0';
  local_340[1] = '\x01';
  local_340[2] = '\x02';
  local_340[3] = '\x02';
  local_43a = 1;
  local_3f0 = (void **)local_3e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"a_position",&local_411);
  glu::va::Float((VertexArrayBinding *)local_3e8,&local_410,2,4,0,colors + 0xe);
  __return_storage_ptr__ = &vertexArrays[0].pointer.data;
  local_3f0 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"a_color",&local_439);
  glu::va::Float((VertexArrayBinding *)__return_storage_ptr__,&local_438,4,4,0,(float *)indices);
  local_43a = 0;
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar9,(ShaderProgram *)local_f0);
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_f0);
  if (bVar3) {
    pcVar1 = *(code **)(lVar8 + 0x78);
    dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&colorBuf0.super_ObjectWrapper.m_object);
    (*pcVar1)(0x8d40,dVar4);
    for (local_468 = 0; local_468 < 2; local_468 = local_468 + 1) {
      if (local_468 == 0) {
        local_8c8 = glu::ObjectWrapper::operator*
                              ((ObjectWrapper *)&colorBuf1.super_ObjectWrapper.m_object);
      }
      else {
        local_8c8 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_2d0);
      }
      drawBuffers[1] = local_8c8;
      (**(code **)(lVar8 + 0xa0))(0x8d41,local_8c8);
      (**(code **)(lVar8 + 0x1238))(0x8d41,0x8058,0x80);
      (**(code **)(lVar8 + 0x688))(0x8d40,local_468 + 0x8ce0,0x8d41,drawBuffers[1]);
    }
    while ((dVar5 = ::deGetFalse(), dVar5 == 0 &&
           (iVar6 = (**(code **)(lVar8 + 0x170))(0x8d40), iVar6 == 0x8cd5))) {
      dVar5 = ::deGetFalse();
      if (dVar5 == 0) {
        local_478 = 0x8ce100008ce0;
        (**(code **)(lVar8 + 0x560))(2,&local_478);
        pcVar1 = *(code **)(lVar8 + 0x1a8);
        local_48c = (deUint32)tcu::RGBA::red();
        tcu::RGBA::toVec((RGBA *)&local_488);
        pfVar10 = tcu::Vector<float,_4>::getPtr(&local_488);
        (*pcVar1)(0x1800,0,pfVar10);
        pcVar1 = *(code **)(lVar8 + 0x1a8);
        local_4a0 = (deUint32)tcu::RGBA::red();
        tcu::RGBA::toVec((RGBA *)&local_49c);
        pfVar10 = tcu::Vector<float,_4>::getPtr(&local_49c);
        (*pcVar1)(0x1800,1,pfVar10);
        (**(code **)(lVar8 + 0x1a00))(0,0,0x80);
        pcVar1 = *(code **)(lVar8 + 0x1680);
        dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f0);
        (*pcVar1)(dVar4);
        dVar4 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar4,"Setup failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                        ,0x131);
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_620,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_620,
                             (char (*) [71])
                             "Drawing to attachments 0 and 1, expecting only attachment 0 to change."
                            );
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_620);
        for (local_624 = 0; local_624 < 2; local_624 = local_624 + 1) {
          (**(code **)(lVar8 + 0x14f0))(local_870,local_624);
          dVar2 = program.m_program.m_info.linkTimeUs;
          dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f0);
          glu::pr::Triangles((PrimitiveList *)&result.m_pixels.m_cap,6,local_340);
          glu::draw((RenderContext *)dVar2,dVar4,2,(VertexArrayBinding *)local_3e8,
                    (PrimitiveList *)&result.m_pixels.m_cap,(DrawUtilCallback *)0x0);
        }
        dVar4 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar4,"Rendering failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                        ,0x13b);
        tcu::Surface::Surface((Surface *)local_658,0x80,0x80);
        this_02 = (RenderTarget *)
                  (**(code **)(*(long *)program.m_program.m_info.linkTimeUs + 0x20))();
        this_03 = tcu::RenderTarget::getPixelFormat(this_02);
        RStack_660 = tcu::PixelFormat::getColorThreshold(this_03);
        tcu::RGBA::RGBA((RGBA *)&ndx_2,1,1,1,1);
        local_65c = tcu::operator+(&stack0xfffffffffffff9a0,(RGBA *)&ndx_2);
        local_665 = 1;
        for (local_66c = 0; local_66c < 2; local_66c = local_66c + 1) {
          pTVar9 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_7f0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (&local_7f0,(char (*) [22])"Verifying attachment ");
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_66c);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [4])0x2b51841);
          tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_7f0);
          (**(code **)(lVar8 + 0x1218))(local_66c + 0x8ce0);
          dVar2 = program.m_program.m_info.linkTimeUs;
          tcu::Surface::getAccess(&local_818,(Surface *)local_658);
          glu::readPixels((RenderContext *)dVar2,0,0,&local_818);
          dVar4 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar4,"Reading pixels failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                          ,0x148);
          pTVar9 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          if (local_66c == 0) {
            local_81c = tcu::RGBA::green();
          }
          else {
            local_81c = tcu::RGBA::red();
          }
          bVar3 = compareSingleColor(pTVar9,(Surface *)local_658,local_81c,local_65c);
          if (!bVar3) {
            local_665 = 0;
          }
        }
        description = "Image comparison failed";
        if ((local_665 & 1) != 0) {
          description = "Pass";
        }
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   (byte)~local_665 & QP_TEST_RESULT_FAIL,description);
        tcu::Surface::~Surface((Surface *)local_658);
        local_9a8 = (VertexArrayBinding *)&vertexArrays[1].pointer.data;
        do {
          local_9a8 = local_9a8 + -1;
          glu::VertexArrayBinding::~VertexArrayBinding(local_9a8);
        } while (local_9a8 != (VertexArrayBinding *)local_3e8);
        glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
                  ((TypedObjectWrapper<(glu::ObjectType)2> *)local_2d0);
        glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
                  ((TypedObjectWrapper<(glu::ObjectType)2> *)&colorBuf1.super_ObjectWrapper.m_object
                  );
        glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
                  ((TypedObjectWrapper<(glu::ObjectType)3> *)&colorBuf0.super_ObjectWrapper.m_object
                  );
        glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_f0);
        return STOP;
      }
    }
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,
               "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
               ,0x124);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  rbo._2_1_ = 1;
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"Dynamic indexing of gl_FragData[] not supported",
             (allocator<char> *)((long)&rbo + 3));
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)&ndx);
  rbo._2_1_ = 0;
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&		renderCtx		= m_context.getRenderContext();
		const glu::ShaderProgram		program			(renderCtx, glu::ProgramSources()
															<< glu::VertexSource(
																"attribute highp vec4 a_position;\n"
																"attribute highp vec4 a_color;\n"
																"varying mediump vec4 v_color;\n"
																"void main (void)\n"
																"{\n"
																"	gl_Position = a_position;\n"
																"	v_color = a_color;\n"
																"}\n")
															<< glu::FragmentSource(
																"varying mediump vec4 v_color;\n"
																"uniform mediump int u_index;\n"
																"void main (void)\n"
																"{\n"
																"	gl_FragData[u_index] = v_color;\n"
																"}\n"));
		const glw::Functions&			gl				= renderCtx.getFunctions();
		const int						width			= 128;
		const int						height			= 128;
		const int						indexLoc		= program.isOk() ? gl.getUniformLocation(program.getProgram(), "u_index") : -1;
		const glu::Framebuffer			fbo				(renderCtx);
		const glu::Renderbuffer			colorBuf0		(renderCtx);
		const glu::Renderbuffer			colorBuf1		(renderCtx);

		const float positions[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			-1.0f, +1.0f,
			+1.0f, +1.0f
		};
		const float colors[] =
		{
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f
		};
		const deUint8	indices[]		= { 0, 1, 2, 2, 1, 3 };

		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	2, 4, 0, &positions[0]),
			glu::va::Float("a_color",		4, 4, 0, &colors[0])
		};

		m_testCtx.getLog() << program;

		if (!program.isOk())
			throw tcu::NotSupportedError("Dynamic indexing of gl_FragData[] not supported");

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		for (int ndx = 0; ndx < 2; ndx++)
		{
			const deUint32	rbo	= ndx == 0 ? *colorBuf0 : *colorBuf1;

			gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
			gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, width, height);
			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0+ndx, GL_RENDERBUFFER, rbo);
		}
		TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

		{
			const deUint32 drawBuffers[] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
			gl.drawBuffers(DE_LENGTH_OF_ARRAY(drawBuffers), &drawBuffers[0]);
		}

		gl.clearBufferfv(GL_COLOR, 0, tcu::RGBA::red().toVec().getPtr());
		gl.clearBufferfv(GL_COLOR, 1, tcu::RGBA::red().toVec().getPtr());

		gl.viewport		(0, 0, width, height);
		gl.useProgram	(program.getProgram());

		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		m_testCtx.getLog() << TestLog::Message << "Drawing to attachments 0 and 1, expecting only attachment 0 to change." << TestLog::EndMessage;

		for (int ndx = 0; ndx < 2; ndx++)
		{
			gl.uniform1i(indexLoc, ndx);
			glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed");

		{
			tcu::Surface		result		(width, height);
			const tcu::RGBA		threshold	= renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
			bool				allOk		= true;

			for (int ndx = 0; ndx < 2; ndx++)
			{
				m_testCtx.getLog() << TestLog::Message << "Verifying attachment " << ndx << "..." << TestLog::EndMessage;

				gl.readBuffer(GL_COLOR_ATTACHMENT0+ndx);
				glu::readPixels(renderCtx, 0, 0, result.getAccess());
				GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

				if (!compareSingleColor(m_testCtx.getLog(), result, ndx == 0 ? tcu::RGBA::green() : tcu::RGBA::red(), threshold))
					allOk = false;
			}

			m_testCtx.setTestResult(allOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									allOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}